

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int y2;
  int y2_00;
  int iVar5;
  uint uVar6;
  int x2;
  int x2_00;
  int x2_01;
  long lVar7;
  int local_be4;
  uint local_bdc;
  gdPoint pts [363];
  
  local_bdc = 0x168;
  uVar6 = 0;
  if (s % 0x168 != e % 0x168) {
    uVar6 = s % 0x168;
    if (s < 0x169) {
      uVar6 = s;
    }
    uVar2 = 0;
    if (0 < (int)uVar6) {
      uVar2 = uVar6;
    }
    local_bdc = e % 0x168;
    if (e < 0x169) {
      local_bdc = e;
    }
    uVar6 = (((uVar2 - uVar6) + ((int)uVar6 >> 0x1f)) / 0x168 - ((int)uVar6 >> 0x1f)) * 0x168 +
            uVar6;
    uVar2 = uVar6;
    if ((int)uVar6 < (int)local_bdc) {
      uVar2 = local_bdc;
    }
    local_bdc = (((uVar2 - local_bdc) - (uint)((int)local_bdc < (int)uVar6)) / 0x168 +
                (uint)((int)local_bdc < (int)uVar6)) * 0x168 + local_bdc;
    if (uVar6 == local_bdc) {
      local_bdc = 0x168;
      uVar6 = 0;
    }
  }
  uVar3 = (ulong)uVar6;
  iVar5 = 1;
  lVar7 = 0;
  x2 = 0;
  local_be4 = 0;
  uVar4 = uVar3;
  y2 = 0;
  x2_00 = 0;
  while( true ) {
    iVar1 = (int)lVar7;
    if ((int)local_bdc < (int)(uVar6 + iVar1)) break;
    x2_01 = (int)(((long)gdCosT[uVar3 + (uVar4 / 0x168) * -0x168 + lVar7] * (long)w) / 0x800) + cx;
    y2_00 = (int)(((long)gdSinT[uVar3 + (uVar4 / 0x168) * -0x168 + lVar7] * (long)h) / 0x800) + cy;
    if (iVar1 == 0) {
      x2 = x2_01;
      local_be4 = y2_00;
      if ((style & 3U) == 0) {
        pts[iVar5].x = x2_01;
        pts[iVar5].y = y2_00;
        pts[0].x = cx;
        pts[0].y = cy;
      }
    }
    else if ((style & 1U) == 0) {
      if ((style & 2U) == 0) {
        if (y2_00 == y2) {
          iVar5 = iVar5 + -1;
          if ((((uVar6 - 0x10f) + iVar1 < 0xffffff4b) && (x2_00 < x2_01)) ||
             (((uVar6 - 0x5b) + iVar1 < 0xb3 && (x2_01 < x2_00)))) {
            pts[iVar5].x = x2_01;
          }
        }
        else {
          pts[iVar5].x = x2_01;
          pts[iVar5].y = y2_00;
        }
      }
      else {
        gdImageLine(im,x2_00,y2,x2_01,y2_00,color);
      }
    }
    iVar5 = iVar5 + 1;
    lVar7 = lVar7 + 1;
    uVar4 = uVar4 + 1;
    y2 = y2_00;
    x2_00 = x2_01;
  }
  if ((style & 1U) == 0) {
    if ((style & 2U) != 0) {
      if ((style & 4U) == 0) {
        return;
      }
      gdImageLine(im,cx,cy,x2_00,y2,color);
      y2 = local_be4;
      x2_00 = x2;
      local_be4 = cy;
      x2 = cx;
LAB_0010d9b1:
      gdImageLine(im,x2,local_be4,x2_00,y2,color);
      return;
    }
    pts[iVar5].x = cx;
    pts[iVar5].y = cy;
    iVar5 = iVar5 + 1;
  }
  else {
    if ((style & 2U) != 0) {
      if ((style & 4U) != 0) {
        gdImageLine(im,cx,cy,x2_00,y2,color);
        gdImageLine(im,cx,cy,x2,local_be4,color);
      }
      goto LAB_0010d9b1;
    }
    pts[0].y = local_be4;
    iVar5 = 3;
    pts[0].x = x2;
    pts[1].x = x2_00;
    pts[1].y = y2;
    pts[2].x = cx;
    pts[2].y = cy;
  }
  gdImageFilledPolygon(im,pts,iVar5,color);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[363];
	int i, pti;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s, pti = 1; (i <= e); i++, pti++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					if (y == ly) {
						pti--; /* don't add this point */
						if (((i > 270 || i < 90) && x > lx) || ((i >  90 && i < 270) && x < lx)) {
							/* replace the old x coord, if increasing on the
							   right side or decreasing on the left side */
							pts[pti].x = x;
						}
					} else {
						pts[pti].x = x;
						pts[pti].y = y;
					}
				}
			}
		} else {
			fx = x;
			fy = y;

			if (!(style & (gdChord | gdNoFill))) {
				pts[0].x = cx;
				pts[0].y = cy;
				pts[pti].x = x;
				pts[pti].y = y;
			}
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		} else {
			pts[pti].x = cx;
			pts[pti].y = cy;
			gdImageFilledPolygon(im, pts, pti+1, color);
		}
	}
}